

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O1

void gl4cts::MultiBind::fillMSTexture(Context *context,GLuint texture_id,GLuint value,bool is_array)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 in_register_00000009;
  char *pcVar4;
  string source;
  size_t position;
  Program program;
  allocator<char> local_18d;
  GLuint local_18c;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  size_t local_108;
  string local_100;
  string local_e0;
  string local_c0;
  Program local_a0;
  long lVar3;
  
  local_18c = value;
  iVar1 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  local_108 = 0;
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_188,
             "#version 430 core\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n\nlayout (location = 0) writeonly uniform IMAGE uni_image;\n\nlayout (location = 1) uniform uint uni_value;\n\nvoid main()\n{\n    const POINT;\n\n    imageStore(uni_image, point, 0, uvec4(uni_value, 0, 0, 0));\n}\n\n"
             ,"");
  pcVar4 = "layout(rgba8ui) uniform uimage2DMS";
  if ((int)CONCAT71(in_register_00000009,is_array) != 0) {
    pcVar4 = "layout(rgba8ui) uniform uimage2DMSArray";
  }
  replaceToken("IMAGE",&local_108,pcVar4 + 0x18,&local_188);
  pcVar4 = "ivec2 point = ivec2(gl_WorkGroupID.x, gl_WorkGroupID.y)";
  if (is_array) {
    pcVar4 = "ivec3 point = ivec3(gl_WorkGroupID.x, gl_WorkGroupID.y, 0)";
  }
  replaceToken("POINT",&local_108,pcVar4,&local_188);
  local_a0.m_id = 0;
  local_a0.m_compute.m_id = 0;
  local_a0.m_fragment.m_id = 0;
  local_a0.m_geometry.m_id = 0;
  local_a0.m_tess_ctrl.m_id = 0;
  local_a0.m_tess_eval.m_id = 0;
  local_a0.m_vertex.m_id = 0;
  local_a0.m_compute.m_context = context;
  local_a0.m_fragment.m_context = context;
  local_a0.m_geometry.m_context = context;
  local_a0.m_tess_ctrl.m_context = context;
  local_a0.m_tess_eval.m_context = context;
  local_a0.m_vertex.m_context = context;
  local_a0.m_context = context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,local_188._M_dataplus._M_p,&local_18d);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,0x1b32ab9);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,0x1b32ab9);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,0x1b32ab9);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,0x1b32ab9);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,0x1b32ab9);
  Program::Init(&local_a0,&local_c0,&local_128,&local_148,&local_168,&local_100,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  iVar1 = (*(local_a0.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x1680))(local_a0.m_id);
  dVar2 = (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x800))();
  glu::checkError(dVar2,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x330);
  (**(code **)(lVar3 + 0x80))(0,texture_id,0,is_array,0,0x88b9,0x8236);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"BindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x605);
  (**(code **)(lVar3 + 0x14f0))(0,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Uniform1i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x608);
  (**(code **)(lVar3 + 0x1500))(1,local_18c);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Uniform1ui",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x60b);
  (**(code **)(lVar3 + 0x528))(6,6,1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"DispatchCompute",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x60f);
  Program::~Program(&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void fillMSTexture(deqp::Context& context, GLuint texture_id, GLuint value, bool is_array)
{
	/* */
	static const GLchar* cs = "#version 430 core\n"
							  "\n"
							  "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
							  "\n"
							  "layout (location = 0) writeonly uniform IMAGE uni_image;\n"
							  "\n"
							  "layout (location = 1) uniform uint uni_value;\n"
							  "\n"
							  "void main()\n"
							  "{\n"
							  "    const POINT;\n"
							  "\n"
							  "    imageStore(uni_image, point, 0, uvec4(uni_value, 0, 0, 0));\n"
							  "}\n"
							  "\n";

	static const GLchar* array_image   = "uimage2DMSArray";
	static const GLchar* array_point   = "ivec3 point = ivec3(gl_WorkGroupID.x, gl_WorkGroupID.y, 0)";
	static const GLchar* regular_image = "uimage2DMS";
	static const GLchar* regular_point = "ivec2 point = ivec2(gl_WorkGroupID.x, gl_WorkGroupID.y)";

	/* */
	const Functions& gl		  = context.getRenderContext().getFunctions();
	const GLchar*	image	= (true == is_array) ? array_image : regular_image;
	const GLchar*	point	= (true == is_array) ? array_point : regular_point;
	size_t			 position = 0;
	std::string		 source   = cs;

	/* */
	replaceToken("IMAGE", position, image, source);
	replaceToken("POINT", position, point, source);

	/* */
	Program program(context);
	program.Init(source.c_str(), "", "", "", "", "");
	program.Use();

	/* */
	if (true == is_array)
	{
		gl.bindImageTexture(0 /* unit */, texture_id, 0 /* level */, GL_TRUE /* layered */, 0 /* layer */,
							GL_WRITE_ONLY, GL_R32UI);
	}
	else
	{
		gl.bindImageTexture(0 /* unit */, texture_id, 0 /* level */, GL_FALSE /* layered */, 0 /* layer */,
							GL_WRITE_ONLY, GL_R32UI);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");

	gl.uniform1i(0 /* location */, 0 /* image unit*/);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

	gl.uniform1ui(1 /* location */, value /* uni_value */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1ui");

	/* */
	gl.dispatchCompute(6, 6, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");
}